

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  size_type *psVar1;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 auVar6 [8];
  _Alloc_hider _Var7;
  pointer pcVar8;
  size_type sVar9;
  string *in_RDI;
  char *local_118;
  string format;
  long local_f0;
  long local_e8 [2];
  FilePath local_d8;
  FilePath local_b8;
  FilePath local_98;
  undefined1 local_78 [8];
  FilePath output_name;
  undefined1 local_50 [8];
  FilePath result;
  
  pcVar4 = FLAGS_gtest_output_abi_cxx11_;
  GetOutputFormat_abi_cxx11_();
  if (format._M_dataplus._M_p == (pointer)0x0) {
    psVar1 = &output_name.pathname_._M_string_length;
    local_78 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"xml","");
    std::__cxx11::string::operator=((string *)&local_118,(string *)local_78);
    if (local_78 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_78,output_name.pathname_._M_string_length + 1);
    }
  }
  pcVar4 = strchr(pcVar4,0x3a);
  if (pcVar4 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)(format.field_2._M_local_buf + 8));
    psVar1 = &result.pathname_._M_string_length;
    local_50 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_98.pathname_._M_dataplus._M_p,
               local_98.pathname_._M_dataplus._M_p + local_98.pathname_._M_string_length);
    auVar6 = local_50;
    if (result.pathname_._M_dataplus._M_p != (pointer)0x0) {
      pcVar8 = (pointer)0x0;
      do {
        if (((*(char *)((long)local_50 + (long)pcVar8) != '/') || (auVar6 == local_50)) ||
           (*(char *)((long)auVar6 + -1) != '/')) {
          *(char *)auVar6 = *(char *)((long)local_50 + (long)pcVar8);
          auVar6 = (undefined1  [8])((long)auVar6 + 1);
        }
        pcVar8 = pcVar8 + 1;
      } while (result.pathname_._M_dataplus._M_p != pcVar8);
    }
    result.pathname_._M_dataplus._M_p = (pointer)((long)auVar6 - (long)local_50);
    *(char *)auVar6 = '\0';
    paVar2 = &local_d8.pathname_.field_2;
    local_d8.pathname_._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"test_detail","");
    paVar3 = &local_b8.pathname_.field_2;
    local_b8.pathname_._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_d8.pathname_._M_dataplus._M_p,
               local_d8.pathname_._M_dataplus._M_p + local_d8.pathname_._M_string_length);
    _Var7._M_p = local_b8.pathname_._M_dataplus._M_p;
    if (local_b8.pathname_._M_string_length != 0) {
      sVar9 = 0;
      do {
        if (((local_b8.pathname_._M_dataplus._M_p[sVar9] != '/') ||
            (_Var7._M_p == local_b8.pathname_._M_dataplus._M_p)) || (_Var7._M_p[-1] != '/')) {
          *_Var7._M_p = local_b8.pathname_._M_dataplus._M_p[sVar9];
          _Var7._M_p = _Var7._M_p + 1;
        }
        sVar9 = sVar9 + 1;
      } while (local_b8.pathname_._M_string_length != sVar9);
    }
    local_b8.pathname_._M_string_length =
         (long)_Var7._M_p - (long)local_b8.pathname_._M_dataplus._M_p;
    *_Var7._M_p = '\0';
    FilePath::MakeFileName((FilePath *)local_78,(FilePath *)local_50,&local_b8,0,local_118);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    if (local_78 != (undefined1  [8])&output_name.pathname_._M_string_length) {
      operator_delete((void *)local_78,output_name.pathname_._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.pathname_._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8.pathname_._M_dataplus._M_p,
                      local_b8.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.pathname_._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8.pathname_._M_dataplus._M_p,
                      local_d8.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_50,result.pathname_._M_string_length + 1);
    }
    _Var7._M_p = local_98.pathname_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.pathname_._M_dataplus._M_p == &local_98.pathname_.field_2) goto LAB_0010b608;
  }
  else {
    __s = pcVar4 + 1;
    psVar1 = &result.pathname_._M_string_length;
    local_50 = (undefined1  [8])psVar1;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,pcVar4 + sVar5 + 1);
    local_78 = (undefined1  [8])&output_name.pathname_._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_50,result.pathname_._M_dataplus._M_p + (long)local_50);
    auVar6 = local_78;
    if (output_name.pathname_._M_dataplus._M_p != (pointer)0x0) {
      pcVar8 = (pointer)0x0;
      do {
        if (((*(char *)((long)local_78 + (long)pcVar8) != '/') || (auVar6 == local_78)) ||
           (*(char *)((long)auVar6 + -1) != '/')) {
          *(char *)auVar6 = *(char *)((long)local_78 + (long)pcVar8);
          auVar6 = (undefined1  [8])((long)auVar6 + 1);
        }
        pcVar8 = pcVar8 + 1;
      } while (output_name.pathname_._M_dataplus._M_p != pcVar8);
    }
    output_name.pathname_._M_dataplus._M_p = (pointer)((long)auVar6 - (long)local_78);
    *(char *)auVar6 = '\0';
    if (local_50 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_50,result.pathname_._M_string_length + 1);
    }
    if (*(char *)local_78 != '/') {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,
                 (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
      paVar2 = &local_98.pathname_.field_2;
      local_98.pathname_._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_b8.pathname_._M_dataplus._M_p,
                 local_b8.pathname_._M_dataplus._M_p + local_b8.pathname_._M_string_length);
      _Var7._M_p = local_98.pathname_._M_dataplus._M_p;
      if (local_98.pathname_._M_string_length != 0) {
        sVar9 = 0;
        do {
          if (((local_98.pathname_._M_dataplus._M_p[sVar9] != '/') ||
              (_Var7._M_p == local_98.pathname_._M_dataplus._M_p)) ||
             (*(char *)((long)_Var7._M_p + -1) != '/')) {
            *_Var7._M_p = local_98.pathname_._M_dataplus._M_p[sVar9];
            _Var7._M_p = _Var7._M_p + 1;
          }
          sVar9 = sVar9 + 1;
        } while (local_98.pathname_._M_string_length != sVar9);
      }
      local_98.pathname_._M_string_length =
           (long)_Var7._M_p - (long)local_98.pathname_._M_dataplus._M_p;
      *_Var7._M_p = '\0';
      format.field_2._8_8_ = local_e8;
      sVar5 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&format.field_2 + 8),__s,__s + sVar5);
      paVar3 = &local_d8.pathname_.field_2;
      local_d8.pathname_._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,format.field_2._8_8_,local_f0 + format.field_2._8_8_);
      _Var7._M_p = local_d8.pathname_._M_dataplus._M_p;
      if (local_d8.pathname_._M_string_length != 0) {
        sVar9 = 0;
        do {
          if (((local_d8.pathname_._M_dataplus._M_p[sVar9] != '/') ||
              (_Var7._M_p == local_d8.pathname_._M_dataplus._M_p)) || (_Var7._M_p[-1] != '/')) {
            *_Var7._M_p = local_d8.pathname_._M_dataplus._M_p[sVar9];
            _Var7._M_p = _Var7._M_p + 1;
          }
          sVar9 = sVar9 + 1;
        } while (local_d8.pathname_._M_string_length != sVar9);
      }
      local_d8.pathname_._M_string_length =
           (long)_Var7._M_p - (long)local_d8.pathname_._M_dataplus._M_p;
      *_Var7._M_p = '\0';
      FilePath::ConcatPaths((FilePath *)local_50,&local_98,&local_d8);
      std::__cxx11::string::_M_assign((string *)local_78);
      if (local_50 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_50,result.pathname_._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.pathname_._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8.pathname_._M_dataplus._M_p,
                        local_d8.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((long *)format.field_2._8_8_ != local_e8) {
        operator_delete((void *)format.field_2._8_8_,local_e8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.pathname_._M_dataplus._M_p != paVar2) {
        operator_delete(local_98.pathname_._M_dataplus._M_p,
                        local_98.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.pathname_._M_dataplus._M_p != &local_b8.pathname_.field_2) {
        operator_delete(local_b8.pathname_._M_dataplus._M_p,
                        local_b8.pathname_.field_2._M_allocated_capacity + 1);
      }
    }
    if ((output_name.pathname_._M_dataplus._M_p == (pointer)0x0) ||
       (((char *)((long)local_78 + -1))[(long)output_name.pathname_._M_dataplus._M_p] != '/')) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                ((FilePath *)local_50,(FilePath *)local_78,&local_98,
                 local_b8.pathname_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.pathname_._M_dataplus._M_p != &local_b8.pathname_.field_2) {
        operator_delete(local_b8.pathname_._M_dataplus._M_p,
                        local_b8.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.pathname_._M_dataplus._M_p != &local_98.pathname_.field_2) {
        operator_delete(local_98.pathname_._M_dataplus._M_p,
                        local_98.pathname_.field_2._M_allocated_capacity + 1);
      }
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if (local_50 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_50,result.pathname_._M_string_length + 1);
      }
    }
    local_98.pathname_.field_2._M_allocated_capacity = output_name.pathname_._M_string_length;
    _Var7._M_p = (pointer)local_78;
    if (local_78 == (undefined1  [8])&output_name.pathname_._M_string_length) goto LAB_0010b608;
  }
  operator_delete(_Var7._M_p,local_98.pathname_.field_2._M_allocated_capacity + 1);
LAB_0010b608:
  if ((size_type *)local_118 != &format._M_string_length) {
    operator_delete(local_118,format._M_string_length + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}